

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_create_xoauth2_message
                   (SessionHandle *data,char *user,char *bearer,char **outptr,size_t *outlen)

{
  char *__s;
  size_t insize;
  char *xoauth;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  char *bearer_local;
  char *user_local;
  SessionHandle *data_local;
  
  __s = curl_maprintf("user=%s\x01auth=Bearer %s\x01\x01",user,bearer);
  if (__s == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(__s);
    data_local._4_4_ = Curl_base64_encode(data,__s,insize,outptr,outlen);
    if (__s != (char *)0x0) {
      (*Curl_cfree)(__s);
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_create_xoauth2_message(struct SessionHandle *data,
                                          const char *user,
                                          const char *bearer,
                                          char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  char *xoauth = NULL;

  /* Generate the message */
  xoauth = aprintf("user=%s\1auth=Bearer %s\1\1", user, bearer);
  if(!xoauth)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, xoauth, strlen(xoauth), outptr, outlen);

  Curl_safefree(xoauth);

  return result;
}